

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QDockAreaLayout::takeAt(QDockAreaLayout *this,int *x,int index)

{
  int iVar1;
  QLayoutItem *ret;
  QLayoutItem *pQVar2;
  long lVar3;
  
  lVar3 = 0x40;
  while (lVar3 + 0x70 != 0x270) {
    pQVar2 = QDockAreaLayoutInfo::takeAt
                       ((QDockAreaLayoutInfo *)((long)this->corners + lVar3),x,index);
    lVar3 = lVar3 + 0x70;
    if (pQVar2 != (QLayoutItem *)0x0) {
      return pQVar2;
    }
  }
  pQVar2 = this->centralWidgetItem;
  if ((pQVar2 != (QLayoutItem *)0x0) && (iVar1 = *x, *x = iVar1 + 1, iVar1 == index)) {
    this->centralWidgetItem = (QLayoutItem *)0x0;
    return pQVar2;
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem *QDockAreaLayout::takeAt(int *x, int index)
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        QDockAreaLayoutInfo &dock = docks[i];
        if (QLayoutItem *ret = dock.takeAt(x, index))
            return ret;
    }

    if (centralWidgetItem && (*x)++ == index) {
        QLayoutItem *ret = centralWidgetItem;
        centralWidgetItem = nullptr;
        return ret;
    }

    return nullptr;
}